

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::ReplaceMultipleComponentsOfInterfaceVarWith
          (InterfaceVariableScalarReplacement *this,Instruction *interface_var,
          vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          *interface_var_users,
          vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
          *components,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *interface_var_component_indices,
          uint32_t *extra_array_index,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_to_composites,
          unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
          *loads_for_access_chain_to_composites)

{
  vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
  *pvVar1;
  InterfaceVariableScalarReplacement *this_00;
  bool bVar2;
  uint32_t depth_to_component;
  ulong uVar3;
  pointer puVar4;
  ulong uVar5;
  uint local_d8;
  uint local_d4;
  vector<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
  *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_c8;
  InterfaceVariableScalarReplacement *local_c0;
  Instruction *local_b8;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *local_b0;
  uint32_t *local_a8;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_for_access_chain_to_component_values;
  unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
  loads_to_component_values;
  
  local_d4 = (uint)(extra_array_index != (uint32_t *)0x0);
  local_d8 = 0;
  local_d0 = components;
  local_c8 = interface_var_component_indices;
  local_c0 = this;
  local_b8 = interface_var;
  local_b0 = interface_var_users;
  local_a8 = extra_array_index;
  do {
    pvVar1 = local_d0;
    uVar3 = (ulong)local_d8;
    uVar5 = (long)(local_d0->
                  super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_d0->
                  super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar5 <= uVar3) {
LAB_004cf74a:
      return uVar5 <= uVar3;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (interface_var_component_indices,&local_d8);
    this_00 = local_c0;
    loads_to_component_values._M_h._M_buckets = &loads_to_component_values._M_h._M_single_bucket;
    loads_to_component_values._M_h._M_bucket_count = 1;
    loads_to_component_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    loads_to_component_values._M_h._M_element_count = 0;
    loads_to_component_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    loads_to_component_values._M_h._M_rehash_policy._M_next_resize = 0;
    loads_to_component_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
    loads_for_access_chain_to_component_values._M_h._M_buckets =
         &loads_for_access_chain_to_component_values._M_h._M_single_bucket;
    loads_for_access_chain_to_component_values._M_h._M_bucket_count = 1;
    loads_for_access_chain_to_component_values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    loads_for_access_chain_to_component_values._M_h._M_element_count = 0;
    loads_for_access_chain_to_component_values._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    loads_for_access_chain_to_component_values._M_h._M_rehash_policy._M_next_resize = 0;
    loads_for_access_chain_to_component_values._M_h._M_single_bucket = (__node_base_ptr)0x0;
    bVar2 = ReplaceComponentsOfInterfaceVarWith
                      (local_c0,local_b8,local_b0,
                       (pvVar1->
                       super__Vector_base<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents,_std::allocator<spvtools::opt::InterfaceVariableScalarReplacement::NestedCompositeComponents>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_d8,
                       interface_var_component_indices,local_a8,
                       (unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                        *)&loads_to_component_values._M_h,
                       (unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                        *)&loads_for_access_chain_to_component_values._M_h);
    if (!bVar2) {
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&loads_for_access_chain_to_component_values._M_h);
      std::
      _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&loads_to_component_values._M_h);
      goto LAB_004cf74a;
    }
    puVar4 = (interface_var_component_indices->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish + -1;
    (interface_var_component_indices->
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.super__Vector_impl_data
    ._M_finish = puVar4;
    depth_to_component =
         (uint32_t)
         ((ulong)((long)puVar4 -
                 (long)(interface_var_component_indices->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    AddComponentsToCompositesForLoads
              (this_00,(unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                        *)&loads_for_access_chain_to_component_values._M_h,
               loads_for_access_chain_to_composites,depth_to_component);
    AddComponentsToCompositesForLoads
              (this_00,(unordered_map<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>_>
                        *)&loads_to_component_values._M_h,loads_to_composites,
               depth_to_component + local_d4);
    std::
    _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&loads_for_access_chain_to_component_values._M_h);
    std::
    _Hashtable<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&loads_to_component_values._M_h);
    local_d8 = local_d8 + 1;
  } while( true );
}

Assistant:

bool InterfaceVariableScalarReplacement::
    ReplaceMultipleComponentsOfInterfaceVarWith(
        Instruction* interface_var,
        const std::vector<Instruction*>& interface_var_users,
        const std::vector<NestedCompositeComponents>& components,
        std::vector<uint32_t>& interface_var_component_indices,
        const uint32_t* extra_array_index,
        std::unordered_map<Instruction*, Instruction*>* loads_to_composites,
        std::unordered_map<Instruction*, Instruction*>*
            loads_for_access_chain_to_composites) {
  for (uint32_t i = 0; i < components.size(); ++i) {
    interface_var_component_indices.push_back(i);
    std::unordered_map<Instruction*, Instruction*> loads_to_component_values;
    std::unordered_map<Instruction*, Instruction*>
        loads_for_access_chain_to_component_values;
    if (!ReplaceComponentsOfInterfaceVarWith(
            interface_var, interface_var_users, components[i],
            interface_var_component_indices, extra_array_index,
            &loads_to_component_values,
            &loads_for_access_chain_to_component_values)) {
      return false;
    }
    interface_var_component_indices.pop_back();

    uint32_t depth_to_component =
        static_cast<uint32_t>(interface_var_component_indices.size());
    AddComponentsToCompositesForLoads(
        loads_for_access_chain_to_component_values,
        loads_for_access_chain_to_composites, depth_to_component);
    if (extra_array_index) ++depth_to_component;
    AddComponentsToCompositesForLoads(loads_to_component_values,
                                      loads_to_composites, depth_to_component);
  }
  return true;
}